

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::UniqueFileScopeIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,java *this,Descriptor *descriptor)

{
  string *s;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  s = *(string **)(this + 8);
  std::__cxx11::string::string((string *)&local_50,".",&local_71);
  std::__cxx11::string::string((string *)&local_70,"_",&local_72);
  StringReplace(&local_30,s,&local_50,&local_70,true);
  std::operator+(__return_storage_ptr__,"static_",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string UniqueFileScopeIdentifier(const Descriptor* descriptor) {
  return "static_" + StringReplace(descriptor->full_name(), ".", "_", true);
}